

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O1

h2o_compress_context_t *
h2o_compress_brotli_open(h2o_mem_pool_t *pool,int quality,size_t estimated_content_length)

{
  long lVar1;
  h2o_compress_context_t *phVar2;
  uint uVar3;
  uint uVar4;
  
  phVar2 = (h2o_compress_context_t *)
           h2o_mem_alloc_shared(pool,0x50,anon_unknown.dwarf_12d0e3::brotli_context::dispose);
  phVar2[1].name.base = (char *)0x0;
  *(undefined4 *)&phVar2[1].name.len = 0;
  phVar2[1].transform =
       (_func_void_st_h2o_compress_context_t_ptr_h2o_iovec_t_ptr_size_t_h2o_send_state_t_h2o_iovec_t_ptr_ptr_size_t_ptr
        *)0x16;
  *(undefined4 *)&phVar2[2].name.base = 0x1000001;
  phVar2[2].name.len = 0;
  phVar2[2].transform =
       (_func_void_st_h2o_compress_context_t_ptr_h2o_iovec_t_ptr_size_t_h2o_send_state_t_h2o_iovec_t_ptr_ptr_size_t_ptr
        *)0x0;
  phVar2[3].name.base = (char *)0x0;
  (phVar2->name).base = "br";
  (phVar2->name).len = 2;
  phVar2->transform = anon_unknown.dwarf_12d0e3::brotli_context::_compress;
  *(int *)((long)&phVar2[1].name.len + 4) = quality;
  if (estimated_content_length != 0xffffffffffffffff) {
    lVar1 = 0x3f;
    if (estimated_content_length - 1 != 0) {
      for (; estimated_content_length - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = 1;
    if (1 < estimated_content_length) {
      uVar3 = ((uint)lVar1 ^ 0xffffffc0) + 0x41;
    }
    if (uVar3 < 0x16) {
      uVar4 = 10;
      if (10 < uVar3) {
        uVar4 = uVar3;
      }
      *(uint *)&phVar2[1].transform = uVar4;
    }
  }
  return phVar2;
}

Assistant:

h2o_compress_context_t *h2o_compress_brotli_open(h2o_mem_pool_t *pool, int quality, size_t estimated_content_length)
{
    brotli_context *ctx = static_cast<brotli_context *>(h2o_mem_alloc_shared(pool, sizeof(*ctx), brotli_context::dispose));
    return new (ctx) brotli_context(quality, estimated_content_length);
}